

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BPlusTree.h
# Opt level: O2

void __thiscall BPlusTree<int>::fix_excess(BPlusTree<int> *this,int index)

{
  BPlusTree<int> *size1;
  BPlusTree<int> **ppBVar1;
  BPlusTree<int> *this_00;
  int item;
  BPlusTree<int> *split;
  
  ppBVar1 = b_array::Array<BPlusTree<int>_*>::operator[](&this->subset,(long)index);
  size1 = *ppBVar1;
  if (2 < size1->data_size) {
    this_00 = (BPlusTree<int> *)operator_new(0x40);
    BPlusTree(this_00,this->duplicates_allowed);
    split = this_00;
    b_array::split<int>(&size1->data,&size1->data_size,&this_00->data,(size_t *)this_00);
    b_array::split<BPlusTree<int>*>
              (&size1->subset,&size1->subset_size,&this_00->subset,&this_00->subset_size);
    this_00->next = size1->next;
    size1->next = this_00;
    item = b_array::detach_item<int>(&size1->data,&size1->data_size);
    b_array::ordered_insert<int>(&this->data,&this->data_size,&item);
    b_array::insert_item<BPlusTree<int>*>(&this->subset,(long)(index + 1),&this->subset_size,&split)
    ;
    if (split->subset_size == 0) {
      b_array::ordered_insert<int>(&split->data,&split->data_size,&item);
    }
  }
  return;
}

Assistant:

void BPlusTree<T>::fix_excess(int index) {
    BPlusTree<T>* node = subset[index];
    // dont do anything, why are we even here to begin with?
    if (node->data_size <= MAXIMUM)
        return;
    BPlusTree<T>* split = new BPlusTree<T>(duplicates_allowed);
    // split data and child
    b_array::split(node->data, node->data_size, split->data, split->data_size);
    b_array::split(node->subset, node->subset_size, split->subset,
                 split->subset_size);

    // connect the nodes together
    split->next = node->next;
    node->next = split;

    // insert the last item into self
    T item = b_array::detach_item(node->data, node->data_size);
    b_array::ordered_insert(data, data_size, item);
    b_array::insert_item(subset, index + 1, subset_size, split);

    // insert the item into the new node
    if (split->is_leaf())
        b_array::ordered_insert(split->data, split->data_size, item);
}